

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O1

TexDictionary * rw::TexDictionary::streamRead(Stream *stream)

{
  LLLink *pLVar1;
  bool bVar2;
  bool bVar3;
  int16 iVar4;
  TexDictionary *this;
  Texture *object;
  int iVar5;
  
  bVar2 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar2) {
    iVar4 = Stream::readI16(stream);
    Stream::readI16(stream);
    this = create();
    if (this != (TexDictionary *)0x0) {
      bVar2 = 0 < iVar4;
      if (0 < iVar4) {
        iVar5 = 1;
        do {
          bVar3 = findChunk(stream,0x15,(uint32 *)0x0,(uint32 *)0x0);
          if (!bVar3) {
            streamRead();
LAB_0011159d:
            if (bVar2) goto LAB_001115b9;
            break;
          }
          object = Texture::streamReadNative(stream);
          if (object == (Texture *)0x0) goto LAB_0011159d;
          PluginList::streamRead((PluginList *)&Texture::s_plglist,stream,object);
          if (object->dict != (TexDictionary *)0x0) {
            pLVar1 = (object->inDict).prev;
            pLVar1->next = (object->inDict).next;
            ((object->inDict).next)->prev = pLVar1;
          }
          object->dict = this;
          (object->inDict).next = &(this->textures).link;
          (object->inDict).prev = (this->textures).link.prev;
          ((this->textures).link.prev)->next = &object->inDict;
          (this->textures).link.prev = &object->inDict;
          bVar2 = iVar5 < iVar4;
          bVar3 = iVar5 != iVar4;
          iVar5 = iVar5 + 1;
        } while (bVar3);
      }
      bVar2 = PluginList::streamRead((PluginList *)&s_plglist,stream,this);
      if (bVar2) {
        return this;
      }
LAB_001115b9:
      destroy(this);
    }
  }
  else {
    streamRead();
  }
  return (TexDictionary *)0x0;
}

Assistant:

TexDictionary*
TexDictionary::streamRead(Stream *stream)
{
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	int32 numTex = stream->readI16();
	stream->readI16(); // device id (0 = unknown, 1 = d3d8, 2 = d3d9,
	                   // 3 = gcn, 4 = null, 5 = opengl,
	                   // 6 = ps2, 7 = softras, 8 = xbox, 9 = psp)
	TexDictionary *txd = TexDictionary::create();
	if(txd == nil)
		return nil;
	Texture *tex;
	for(int32 i = 0; i < numTex; i++){
		if(!findChunk(stream, ID_TEXTURENATIVE, nil, nil)){
			RWERROR((ERR_CHUNK, "TEXTURENATIVE"));
			goto fail;
		}
		tex = Texture::streamReadNative(stream);
		if(tex == nil)
			goto fail;
		Texture::s_plglist.streamRead(stream, tex);
		txd->add(tex);
	}
	if(s_plglist.streamRead(stream, txd))
		return txd;
fail:
	txd->destroy();
	return nil;
}